

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

InlinedStringField * __thiscall
google::protobuf::Reflection::GetRawSplit<google::protobuf::internal::InlinedStringField>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  InlinedStringField *pIVar4;
  LogMessage aLStack_38 [16];
  
  this_00 = &this->schema_;
  bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar2) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aLStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/message.h"
               ,0x642,0x1b,"!schema_.InRealOneof(field)");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_38,8,"Field = ");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (aLStack_38,(string *)(field->all_names_ + 1));
  }
  else {
    if ((this->schema_).split_offset_ != -1) {
      uVar3 = internal::ReflectionSchema::SplitOffset(this_00);
      lVar1 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
      uVar3 = internal::ReflectionSchema::GetFieldOffsetNonOneof(this_00,field);
      bVar2 = internal::SplitFieldHasExtraIndirection(field);
      pIVar4 = (InlinedStringField *)((ulong)uVar3 + lVar1);
      if (bVar2) {
        pIVar4 = (InlinedStringField *)(pIVar4->field_0).str_._M_dataplus._M_p;
      }
      return pIVar4;
    }
    GetRawSplit<google::protobuf::internal::InlinedStringField>();
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_38)
  ;
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}